

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip.c
# Opt level: O1

void test_arm_filter(char *refname)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive *a;
  archive_conflict *a_00;
  char *v2;
  la_int64_t v2_00;
  la_ssize_t v2_01;
  unsigned_long uVar4;
  archive_entry *ae;
  char buff [7804];
  archive_entry *local_1ec0;
  undefined1 local_1eb8 [7816];
  
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'Ф',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  extract_reference_file(refname);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ш',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'Щ',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL"
                   ,(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ъ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ы',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a_00);
  wVar2 = archive_read_open_filename(a_00,refname,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ю',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,&local_1ec0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'а',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  mVar3 = archive_entry_mode(local_1ec0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'б',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  v2 = archive_entry_pathname(local_1ec0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
             ,L'в',"hw-gnueabihf","\"hw-gnueabihf\"",v2,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  v2_00 = archive_entry_size(local_1ec0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'г',0x1e7c,"sizeof(buff)",v2_00,"archive_entry_size(ae)",(void *)0x0);
  v2_01 = archive_read_data((archive *)a_00,local_1eb8,0x1e7c);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'д',0x1e7c,"sizeof(buff)",v2_01,"archive_read_data(a, buff, sizeof(buff))",
                      (void *)0x0);
  uVar4 = bitcrc32(0,local_1eb8,0x1e7c);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ж',uVar4 & 0xffffffff,"computed_crc",0x355ec4e1,"expected_crc",(void *)0x0
                     );
  iVar1 = archive_file_count((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'и',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a_00,&local_1ec0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'к',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_read_close((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'м',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'н',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_arm_filter(const char *refname)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[7804];
	uint32_t computed_crc = 0;
	uint32_t expected_crc = 0x355ec4e1;

	assert((a = archive_read_new()) != NULL);

	extract_reference_file(refname);

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));

	assertEqualIntA(a, ARCHIVE_OK,
		archive_read_open_filename(a, refname, 10240));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	assertEqualString("hw-gnueabihf", archive_entry_pathname(ae));
	assertEqualInt(sizeof(buff), archive_entry_size(ae));
	assertEqualInt(sizeof(buff), archive_read_data(a, buff, sizeof(buff)));
	computed_crc = bitcrc32(computed_crc, buff, sizeof(buff));
	assertEqualInt(computed_crc, expected_crc);

	assertEqualInt(1, archive_file_count(a));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}